

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

StatusOr<draco::EncodedGeometryType> *
draco::Decoder::GetEncodedGeometryType
          (StatusOr<draco::EncodedGeometryType> *__return_storage_ptr__,DecoderBuffer *in_buffer)

{
  string *this;
  Status _local_status;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  allocator<char> local_a1;
  undefined1 local_a0 [44];
  DracoHeader local_74;
  string local_68 [32];
  DecoderBuffer local_48;
  
  local_48.bit_mode_ = in_buffer->bit_mode_;
  local_48._49_1_ = in_buffer->field_0x31;
  local_48.bitstream_version_ = in_buffer->bitstream_version_;
  local_48._52_4_ = *(undefined4 *)&in_buffer->field_0x34;
  local_48.data_ = in_buffer->data_;
  local_48.data_size_ = in_buffer->data_size_;
  local_48.pos_ = in_buffer->pos_;
  local_48.bit_decoder_.bit_buffer_ = (in_buffer->bit_decoder_).bit_buffer_;
  local_48.bit_decoder_.bit_buffer_end_ = (in_buffer->bit_decoder_).bit_buffer_end_;
  local_48.bit_decoder_.bit_offset_ = (in_buffer->bit_decoder_).bit_offset_;
  PointCloudDecoder::DecodeHeader((Status *)local_a0,&local_48,&local_74);
  if (local_a0._0_4_ == OK) {
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    if (local_74.encoder_type < 2) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = (uint)local_74.encoder_type;
      goto LAB_0011f8c3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"Unsupported geometry type.",&local_a1);
    local_a0._0_4_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)(local_a0 + 8),local_68);
    Status::Status(&__return_storage_ptr__->status_,(Status *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    this = local_68;
  }
  else {
    Status::Status(&__return_storage_ptr__->status_,(Status *)local_a0);
    this = (string *)(local_a0 + 8);
  }
  std::__cxx11::string::~string(this);
LAB_0011f8c3:
  DecoderBuffer::BitDecoder::~BitDecoder(&local_48.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<EncodedGeometryType> Decoder::GetEncodedGeometryType(
    DecoderBuffer *in_buffer) {
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header));
  if (header.encoder_type >= NUM_ENCODED_GEOMETRY_TYPES) {
    return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
  }
  return static_cast<EncodedGeometryType>(header.encoder_type);
}